

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_writeCompileInfo
                 (qpTestLog *log,char *name,char *description,deBool compileOk,char *infoLog)

{
  deBool dVar1;
  deBool dVar2;
  qpXmlAttribute attribs [3];
  qpXmlAttribute local_88;
  char *local_68;
  undefined4 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined8 local_30;
  
  deMutex_lock(log->lock);
  local_88.name = "Name";
  local_88.type = QP_XML_ATTRIBUTE_STRING;
  local_88.intValue = -0x2a6;
  local_88.boolValue = -1;
  local_68 = "Description";
  local_60 = 0;
  local_50 = 0xfffffffffffffd5a;
  local_38 = "OK";
  if (compileOk == 0) {
    local_38 = "Fail";
  }
  local_48 = "CompileStatus";
  local_40 = 0;
  local_30 = 0xfffffffffffffd5a;
  local_88.stringValue = name;
  local_58 = description;
  dVar1 = qpXmlWriter_startElement(log->writer,"CompileInfo",3,&local_88);
  if (dVar1 != 0) {
    dVar1 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",infoLog);
    if (dVar1 != 0) {
      dVar1 = qpXmlWriter_endElement(log->writer,"CompileInfo");
      dVar2 = 1;
      if (dVar1 != 0) goto LAB_00211b48;
    }
  }
  qpPrintf("qpTestLog_writeCompileInfo(): Writing XML failed\n");
  dVar2 = 0;
LAB_00211b48:
  deMutex_unlock(log->lock);
  return dVar2;
}

Assistant:

deBool qpTestLog_writeCompileInfo (qpTestLog* log, const char* name, const char* description, deBool compileOk, const char* infoLog)
{
	int				numAttribs = 0;
	qpXmlAttribute	attribs[3];

	DE_ASSERT(log && name && description && infoLog);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	attribs[numAttribs++] = qpSetStringAttrib("CompileStatus", compileOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, "CompileInfo", numAttribs, attribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", infoLog) ||
		!qpXmlWriter_endElement(log->writer, "CompileInfo"))
	{
		qpPrintf("qpTestLog_writeCompileInfo(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}